

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

_Bool plane_ray3_intersection(plane_t p,ray3_t r,vec3_t *out)

{
  float fVar1;
  float fVar2;
  vec3_t vVar3;
  undefined8 local_f8;
  float local_f0;
  float t;
  vec3_t n;
  vec3_t *out_local;
  plane_t p_local;
  
  p_local.b = p.d;
  vVar3 = plane_normal(p);
  fVar1 = vec3_dot(vVar3,r.start);
  fVar2 = vec3_dot(vVar3,r.direction);
  fVar2 = -(p_local.b + fVar1) / fVar2;
  if (0.0 <= fVar2) {
    vVar3 = vec3_mulf(r.direction,fVar2);
    vVar3 = vec3_add(r.start,vVar3);
    local_f8 = vVar3._0_8_;
    local_f0 = vVar3.z;
    out->x = (float)(undefined4)local_f8;
    out->y = (float)local_f8._4_4_;
    out->z = local_f0;
  }
  return 0.0 <= fVar2;
}

Assistant:

bool
plane_ray3_intersection(plane_t p, ray3_t r, vec3_t* out) {
    vec3_t	n	= plane_normal(p);
    float	t	=  -(p.d + vec3_dot(n, r.start)) / vec3_dot(n, r.direction);
    if( t < 0.0f )
        return false;
    *out	= vec3_add(r.start,
               vec3_mulf(r.direction,
                     t));
    return true;
}